

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void HorizontalFilter_SSE2(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_R8;
  uint8_t *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe8;
  
  DoHorizontalFilter_SSE2
            ((uint8_t *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe8,
             (int)((ulong)in_R8 >> 0x20),in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void HorizontalFilter_SSE2(const uint8_t* WEBP_RESTRICT data,
                                  int width, int height, int stride,
                                  uint8_t* WEBP_RESTRICT filtered_data) {
  DoHorizontalFilter_SSE2(data, width, height, stride, filtered_data);
}